

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::MemoryStressCase::MemoryStressCase
          (MemoryStressCase *this,EglTestContext *eglTestCtx,Spec spec,char *name,char *description)

{
  deUint32 dVar1;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MemoryStressCase_02160550;
  (this->m_spec).types = spec.types;
  (this->m_spec).minWidth = spec.minWidth;
  (this->m_spec).minHeight = spec.minHeight;
  (this->m_spec).maxWidth = spec.maxWidth;
  (this->m_spec).maxHeight = spec.maxHeight;
  (this->m_spec).use = spec.use;
  *(undefined3 *)&(this->m_spec).field_0x15 = spec._21_3_;
  (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_allocationCounts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_allocator = (MemoryAllocator *)0x0;
  this->m_iteration = 0;
  this->m_iterationCount = 10;
  dVar1 = deStringHash(name);
  this->m_seed = dVar1;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  return;
}

Assistant:

MemoryStressCase::MemoryStressCase (EglTestContext& eglTestCtx, Spec spec, const char* name, const char* description)
	: TestCase			(eglTestCtx, name, description)
	, m_spec			(spec)
	, m_allocator		(NULL)
	, m_iteration		(0)
	, m_iterationCount	(10)
	, m_seed			(deStringHash(name))
	, m_display			(EGL_NO_DISPLAY)
	, m_config			(DE_NULL)
{
}